

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

size_t __thiscall
spvtools::opt::analysis::ConstantHash::operator()(ConstantHash *this,Constant *const_val)

{
  char32_t *pcVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar6;
  uint *w;
  char32_t *pcVar7;
  Constant **c;
  u32string h;
  hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_41;
  u32string local_40;
  long *plVar4;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = L'\0';
  add_pointer(this,&local_40,const_val->type_);
  iVar3 = (*const_val->_vptr_Constant[0xd])(const_val);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    iVar3 = (*const_val->_vptr_Constant[0x11])(const_val);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (plVar4 == (long *)0x0) {
      iVar3 = (*const_val->_vptr_Constant[0x16])(const_val);
      if (CONCAT44(extraout_var_01,iVar3) == 0) {
        __assert_fail("false && \"Tried to compute the hash value of an invalid Constant instance.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                      ,0x1d7,
                      "size_t spvtools::opt::analysis::ConstantHash::operator()(const Constant *) const"
                     );
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_40,L'\0');
    }
    else {
      puVar5 = (undefined8 *)(**(code **)(*plVar4 + 0xc0))(plVar4);
      puVar2 = (undefined8 *)puVar5[1];
      for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        add_pointer(this,&local_40,(void *)*puVar5);
      }
    }
  }
  else {
    puVar5 = (undefined8 *)(**(code **)(*plVar4 + 0xc0))(plVar4);
    pcVar1 = (char32_t *)puVar5[1];
    for (pcVar7 = (char32_t *)*puVar5; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_40,*pcVar7);
    }
  }
  sVar6 = std::
          hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator()(&local_41,&local_40);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_dispose(&local_40);
  return sVar6;
}

Assistant:

size_t operator()(const Constant* const_val) const {
    std::u32string h;
    add_pointer(&h, const_val->type());
    if (const auto scalar = const_val->AsScalarConstant()) {
      for (const auto& w : scalar->words()) {
        h.push_back(w);
      }
    } else if (const auto composite = const_val->AsCompositeConstant()) {
      for (const auto& c : composite->GetComponents()) {
        add_pointer(&h, c);
      }
    } else if (const_val->AsNullConstant()) {
      h.push_back(0);
    } else {
      assert(
          false &&
          "Tried to compute the hash value of an invalid Constant instance.");
    }

    return std::hash<std::u32string>()(h);
  }